

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

bool __thiscall
v_hashmap<unsigned_long,_features>::contains
          (v_hashmap<unsigned_long,_features> *this,unsigned_long *key,size_t hash)

{
  hash_elem *phVar1;
  bool bVar2;
  ulong uVar3;
  vw_exception *this_00;
  ulong uVar4;
  ulong uVar5;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  uVar5 = (long)(this->dat).end_array - (long)(this->dat)._begin >> 7;
  uVar4 = hash % uVar5;
  this->last_position = uVar4;
  uVar3 = uVar4;
  do {
    phVar1 = (this->dat)._begin;
    if (phVar1[uVar3].occupied != true) {
      return phVar1[uVar3].occupied;
    }
    if (phVar1[uVar3].hash == hash) {
      bVar2 = is_equivalent(this,key,&phVar1[uVar3].key);
      if (bVar2) {
        return true;
      }
      uVar3 = this->last_position;
    }
    uVar3 = uVar3 + 1;
    if (uVar5 <= uVar3) {
      uVar3 = 0;
    }
    this->last_position = uVar3;
  } while (uVar3 != uVar4);
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_1a8,"error: v_hashmap did not grow enough!");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/v_hashmap.h"
             ,0xfb,&local_1d8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool contains(const K& key, size_t hash)
  {
    size_t sz = base_size();
    size_t first_position = hash % sz;
    last_position = first_position;
    while (true)
    {  // if there's nothing there, obviously we don't contain it
      if (!dat[last_position].occupied)
        return false;

      // there's something there: maybe it's us
      if ((dat[last_position].hash == hash) && is_equivalent(key, dat[last_position].key))
        return true;

      // there's something there that's NOT us -- advance pointer
      last_position++;
      if (last_position >= sz)
        last_position = 0;

      // check to make sure we haven't cycled around -- this is a bug!
      if (last_position == first_position)
        THROW("error: v_hashmap did not grow enough!");
    }
  }